

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void kratos::remove_assertion(Generator *top)

{
  undefined1 local_58 [8];
  AssertionRemoval visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  AssertionRemoval::AssertionRemoval((AssertionRemoval *)local_58);
  IRVisitor::visit_root
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  remove_empty_block((Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  AssertionRemoval::~AssertionRemoval((AssertionRemoval *)local_58);
  return;
}

Assistant:

void remove_assertion(Generator *top) {
    AssertionRemoval visitor;
    visitor.visit_root(top);
    // then remove empty block
    remove_empty_block(top);
}